

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O0

void __thiscall adios2::transport::NullTransport::SeekToEnd(NullTransport *this)

{
  size_t sVar1;
  pointer pNVar2;
  allocator local_b1;
  string local_b0 [20];
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  pNVar2 = std::
           unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                         *)0xd63158);
  if ((pNVar2->IsOpen & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Toolkit",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"transport::NullTransport",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"SeekToEnd",(allocator *)&stack0xffffffffffffff77)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"transport is not open yet",&local_b1);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  pNVar2 = std::
           unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                         *)0xd6336f);
  sVar1 = pNVar2->Capacity;
  pNVar2 = std::
           unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                         *)0xd6338c);
  pNVar2->CurPos = sVar1 - 1;
  return;
}

Assistant:

void NullTransport::SeekToEnd()
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Toolkit", "transport::NullTransport", "SeekToEnd",
                                          "transport is not open yet");
    }
    Impl->CurPos = Impl->Capacity - 1;
}